

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O3

string * __thiscall
testing::internal::StreamableToString<char*>
          (string *__return_storage_ptr__,internal *this,char **streamable)

{
  stringstream *in_RAX;
  size_t sVar1;
  pointer *__ptr;
  ostream *poVar2;
  char *__s;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  
  local_28._M_head_impl = in_RAX;
  Message::Message((Message *)&local_28);
  __s = *(char **)this;
  poVar2 = (ostream *)(local_28._M_head_impl + 0x10);
  if (__s == (char *)0x0) {
    sVar1 = 6;
    __s = "(null)";
  }
  else {
    sVar1 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
  StringStreamToString(__return_storage_ptr__,local_28._M_head_impl);
  if (local_28._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_28._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}